

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_ldd.c
# Opt level: O3

size_t lddmc_serialize_get(MDD mdd)

{
  avl_node_t *paVar1;
  
  paVar1 = lddmc_ser_set;
  if (1 < mdd) {
    while( true ) {
      if (paVar1 == (avl_node_t *)0x0) {
        __assert_fail("ss != NULL",
                      "/workspace/llm4binary/github/license_c_cmakelists/trolando[P]sylvan/src/sylvan_ldd.c"
                      ,0x9cb,"size_t lddmc_serialize_get(MDD)");
      }
      if (paVar1[1].left == (avl_node *)mdd) break;
      paVar1 = *(avl_node_t **)(paVar1->pad + (ulong)(paVar1[1].left <= mdd) * 8 + -0x14);
    }
    mdd = (MDD)paVar1[1].right;
  }
  return (size_t)(avl_node *)mdd;
}

Assistant:

size_t
lddmc_serialize_get(MDD mdd)
{
    if (mdd <= lddmc_true) return mdd;
    struct lddmc_ser s, *ss;
    s.mdd = mdd;
    ss = lddmc_ser_search(lddmc_ser_set, &s);
    assert(ss != NULL);
    return ss->assigned;
}